

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O3

int libssh2_agent_connect(LIBSSH2_AGENT *agent)

{
  int iVar1;
  
  agent->ops = &agent_ops_unix;
  iVar1 = (*agent_ops_unix.connect)(agent);
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_agent_connect(LIBSSH2_AGENT *agent)
{
    int i, rc = -1;
    for(i = 0; supported_backends[i].name; i++) {
        agent->ops = supported_backends[i].ops;
        rc = (agent->ops->connect)(agent);
        if(!rc)
            return 0;
    }
    return rc;
}